

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O0

exr_result_t exr_write_header(exr_context_t ctxt)

{
  _internal_exr_part *p_Var1;
  bool bVar2;
  int32_t iVar3;
  _internal_exr_context *in_RDI;
  _internal_exr_part *curp_1;
  int p_1;
  int32_t ccount;
  _internal_exr_part *curp;
  int p;
  _internal_exr_context *pctxt;
  exr_result_t rv;
  int in_stack_0000004c;
  _internal_exr_part *in_stack_00000050;
  _internal_exr_context *in_stack_00000058;
  _internal_exr_part *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  int iVar4;
  uint local_24;
  uint in_stack_ffffffffffffffe8;
  exr_result_t eVar5;
  _internal_exr_context *p_Var6;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  eVar5 = 0;
  if (in_RDI == (_internal_exr_context *)0x0) {
    eVar5 = 2;
  }
  else {
    p_Var6 = in_RDI;
    internal_exr_lock(in_RDI);
    if (in_RDI->mode == '\x01') {
      if (in_RDI->num_parts == 0) {
        internal_exr_unlock(in_RDI);
        eVar5 = (*in_RDI->report_error)(in_RDI,6,"No parts defined in file prior to writing data");
      }
      else {
        local_24 = 0;
        while( true ) {
          bVar2 = false;
          if (eVar5 == 0) {
            bVar2 = (int)local_24 < in_RDI->num_parts;
          }
          if (!bVar2) break;
          p_Var1 = in_RDI->parts[(int)local_24];
          if (p_Var1->channels == (exr_attribute_t *)0x0) {
            internal_exr_unlock(in_RDI);
            eVar5 = (*in_RDI->print_error)
                              (in_RDI,0xd,"Part %d is missing channel list",(ulong)local_24);
            return eVar5;
          }
          eVar5 = internal_exr_compute_tile_information
                            (in_stack_00000058,in_stack_00000050,in_stack_0000004c);
          if (eVar5 != 0) break;
          iVar3 = internal_exr_compute_chunk_offset_size((_internal_exr_part *)in_RDI);
          p_Var1->chunk_count = iVar3;
          if ((in_RDI->has_nonimage_data != '\0') || (in_RDI->is_multipart != '\0')) {
            internal_exr_unlock(in_RDI);
            eVar5 = exr_attr_set_int((exr_context_t)
                                     CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                                     (int)((ulong)p_Var6 >> 0x20),
                                     (char *)CONCAT44(eVar5,in_stack_ffffffffffffffe8),
                                     (int32_t)((ulong)in_RDI >> 0x20));
            internal_exr_lock(in_RDI);
            if (eVar5 != 0) break;
          }
          eVar5 = internal_exr_validate_write_part
                            ((_internal_exr_context *)CONCAT44(iVar3,in_stack_ffffffffffffffc8),
                             in_stack_ffffffffffffffc0);
          local_24 = local_24 + 1;
        }
        in_RDI->output_file_offset = 0;
        if (eVar5 == 0) {
          eVar5 = internal_exr_write_header
                            ((_internal_exr_context *)(ulong)in_stack_ffffffffffffffe8);
        }
        if (eVar5 == 0) {
          in_RDI->mode = '\x03';
          in_RDI->cur_output_part = 0;
          in_RDI->last_output_chunk = -1;
          in_RDI->output_chunk_count = 0;
          for (iVar4 = 0; iVar4 < in_RDI->num_parts; iVar4 = iVar4 + 1) {
            p_Var1 = in_RDI->parts[iVar4];
            p_Var1->chunk_table_offset = in_RDI->output_file_offset;
            in_RDI->output_file_offset = (long)p_Var1->chunk_count * 8 + in_RDI->output_file_offset;
          }
        }
        internal_exr_unlock(in_RDI);
      }
    }
    else {
      internal_exr_unlock(in_RDI);
      eVar5 = (*in_RDI->standard_error)(in_RDI,8);
    }
  }
  return eVar5;
}

Assistant:

exr_result_t
exr_write_header (exr_context_t ctxt)
{
    exr_result_t rv = EXR_ERR_SUCCESS;
    EXR_PROMOTE_LOCKED_CONTEXT_OR_ERROR (ctxt);

    if (pctxt->mode != EXR_CONTEXT_WRITE)
        return EXR_UNLOCK_AND_RETURN_PCTXT (
            pctxt->standard_error (pctxt, EXR_ERR_NOT_OPEN_WRITE));

    if (pctxt->num_parts == 0)
        return EXR_UNLOCK_AND_RETURN_PCTXT (pctxt->report_error (
            pctxt,
            EXR_ERR_FILE_BAD_HEADER,
            "No parts defined in file prior to writing data"));

    for (int p = 0; rv == EXR_ERR_SUCCESS && p < pctxt->num_parts; ++p)
    {
        struct _internal_exr_part* curp = pctxt->parts[p];

        int32_t ccount = 0;

        if (!curp->channels)
            return EXR_UNLOCK_AND_RETURN_PCTXT (pctxt->print_error (
                pctxt,
                EXR_ERR_MISSING_REQ_ATTR,
                "Part %d is missing channel list",
                p));

        rv = internal_exr_compute_tile_information (pctxt, curp, 0);
        if (rv != EXR_ERR_SUCCESS) break;

        ccount = internal_exr_compute_chunk_offset_size (curp);

        curp->chunk_count = ccount;

        if (pctxt->has_nonimage_data || pctxt->is_multipart)
        {
            EXR_UNLOCK (pctxt);
            rv = exr_attr_set_int (ctxt, p, EXR_REQ_CHUNK_COUNT_STR, ccount);
            EXR_LOCK (pctxt);
            if (rv != EXR_ERR_SUCCESS) break;
        }

        rv = internal_exr_validate_write_part (pctxt, curp);
    }

    pctxt->output_file_offset = 0;

    if (rv == EXR_ERR_SUCCESS) rv = internal_exr_write_header (pctxt);

    if (rv == EXR_ERR_SUCCESS)
    {
        pctxt->mode               = EXR_CONTEXT_WRITING_DATA;
        pctxt->cur_output_part    = 0;
        pctxt->last_output_chunk  = -1;
        pctxt->output_chunk_count = 0;
        for (int p = 0; rv == EXR_ERR_SUCCESS && p < pctxt->num_parts; ++p)
        {
            struct _internal_exr_part* curp = pctxt->parts[p];
            curp->chunk_table_offset        = pctxt->output_file_offset;
            pctxt->output_file_offset +=
                (uint64_t) (curp->chunk_count) * sizeof (uint64_t);
        }
    }

    return EXR_UNLOCK_AND_RETURN_PCTXT (rv);
}